

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageManager.cpp
# Opt level: O3

Message * __thiscall
ki::protocol::dml::MessageManager::create_message
          (MessageManager *this,string *protocol_type,uint8_t message_type)

{
  MessageModule *this_00;
  Message *pMVar1;
  value_error *this_01;
  ostringstream oss;
  string local_1b0;
  ostringstream local_190 [376];
  
  this_00 = get_module(this,protocol_type);
  if (this_00 != (MessageModule *)0x0) {
    pMVar1 = MessageModule::create_message(this_00,message_type);
    return pMVar1;
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,"No service exists with protocol type: ",0x26);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_190,(protocol_type->_M_dataplus)._M_p,protocol_type->_M_string_length)
  ;
  this_01 = (value_error *)__cxa_allocate_exception(0x18);
  std::__cxx11::stringbuf::str();
  value_error::value_error(this_01,&local_1b0,DML_INVALID_PROTOCOL_TYPE);
  __cxa_throw(this_01,&value_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Message *MessageManager::create_message(const std::string& protocol_type, uint8_t message_type) const
	{
		auto *message_module = get_module(protocol_type);
		if (!message_module)
		{
			std::ostringstream oss;
			oss << "No service exists with protocol type: " << protocol_type;
			throw value_error(oss.str(), value_error::DML_INVALID_PROTOCOL_TYPE);
		}

		return message_module->create_message(message_type);
	}